

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

void __thiscall
ObjectFile::ObjectFile
          (ObjectFile *this,OSToken *parent,string *inPath,int inUmask,string *inLockpath,bool isNew
          )

{
  Generation *pGVar1;
  MutexFactory *this_00;
  Mutex *pMVar2;
  undefined8 uVar3;
  undefined4 in_ECX;
  string *in_RDX;
  _func_int **in_RSI;
  OSObject *in_RDI;
  string *in_R8;
  byte in_R9B;
  bool in_stack_0000003f;
  ObjectFile *in_stack_00000040;
  bool in_stack_0000018f;
  ObjectFile *in_stack_00000190;
  bool local_a9;
  string *this_01;
  string local_60 [55];
  byte local_29;
  undefined4 local_1c;
  _func_int **local_10;
  
  local_29 = in_R9B & 1;
  local_1c = in_ECX;
  local_10 = in_RSI;
  OSObject::OSObject(in_RDI);
  in_RDI->_vptr_OSObject = (_func_int **)&PTR__ObjectFile_0017dc30;
  this_01 = (string *)(in_RDI + 1);
  std::__cxx11::string::string(this_01);
  std::
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::map((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
         *)0x1535c6);
  std::__cxx11::string::string((string *)(in_RDI + 0x12));
  std::__cxx11::string::operator=(this_01,in_RDX);
  *(undefined4 *)&in_RDI[5]._vptr_OSObject = local_1c;
  std::__cxx11::string::string(local_60,(string *)(in_RDI + 1));
  pGVar1 = Generation::create((string *)in_RDX,(int)((ulong)this_01 >> 0x20),
                              SUB81((ulong)this_01 >> 0x18,0));
  in_RDI[6]._vptr_OSObject = (_func_int **)pGVar1;
  std::__cxx11::string::~string(local_60);
  this_00 = MutexFactory::i();
  pMVar2 = MutexFactory::getMutex(this_00);
  in_RDI[0xf]._vptr_OSObject = (_func_int **)pMVar2;
  local_a9 = false;
  if (in_RDI[6]._vptr_OSObject != (_func_int **)0x0) {
    local_a9 = in_RDI[0xf]._vptr_OSObject != (_func_int **)0x0;
  }
  *(bool *)&in_RDI[0xd]._vptr_OSObject = local_a9;
  in_RDI[0xe]._vptr_OSObject = local_10;
  *(undefined1 *)&in_RDI[0x10]._vptr_OSObject = 0;
  in_RDI[0x11]._vptr_OSObject = (_func_int **)0x0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x12),in_R8);
  if (((ulong)in_RDI[0xd]._vptr_OSObject & 1) != 0) {
    if ((local_29 & 1) == 0) {
      uVar3 = std::__cxx11::string::c_str();
      softHSMLog(7,"ObjectFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x44,"Opened existing object %s",uVar3);
      refresh(in_stack_00000190,in_stack_0000018f);
    }
    else {
      uVar3 = std::__cxx11::string::c_str();
      softHSMLog(7,"ObjectFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x4a,"Created new object %s",uVar3);
      store(in_stack_00000040,in_stack_0000003f);
    }
  }
  return;
}

Assistant:

ObjectFile::ObjectFile(OSToken* parent, std::string inPath, int inUmask, std::string inLockpath, bool isNew /* = false */)
{
	path = inPath;
	umask = inUmask;
	gen = Generation::create(path, umask, false);
	objectMutex = MutexFactory::i()->getMutex();
	valid = (gen != NULL) && (objectMutex != NULL);
	token = parent;
	inTransaction = false;
	transactionLockFile = NULL;
	lockpath = inLockpath;

	if (!valid) return;

	if (!isNew)
	{
		DEBUG_MSG("Opened existing object %s", path.c_str());

		refresh(true);
	}
	else
	{
		DEBUG_MSG("Created new object %s", path.c_str());

		// Create an empty object file
		store();
	}

}